

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hh
# Opt level: O0

void __thiscall EnvDecl::EnvDecl(EnvDecl *this,string *n,string *s)

{
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  std::__cxx11::string::string(in_RDI + 0x20,in_RDX);
  return;
}

Assistant:

EnvDecl(std::string n, std::string s)
        : name(n)
        , source(s)
    {
    }